

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

int xmlEscapeEntities(uchar *out,int *outlen,xmlChar *in,int *inlen)

{
  byte *pbVar1;
  byte bVar2;
  xmlGenericErrorFunc p_Var3;
  int iVar4;
  long lVar5;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  byte *pbVar8;
  byte *pbVar9;
  uint val;
  uint uVar10;
  byte *out_00;
  byte *pbVar11;
  long lStack_50;
  
  pbVar8 = out + *outlen;
  pbVar11 = in + *inlen;
  pbVar9 = in;
  out_00 = out;
LAB_001a8de4:
  do {
    while( true ) {
      while( true ) {
        if ((pbVar11 <= pbVar9) || (pbVar8 <= out_00)) goto LAB_001a900c;
        bVar2 = *pbVar9;
        if (bVar2 != 0x26) break;
        if ((long)pbVar8 - (long)out_00 < 5) goto LAB_001a900c;
        out_00[0] = 0x26;
        out_00[1] = 0x61;
        out_00[2] = 0x6d;
        out_00[3] = 0x70;
        out_00[4] = 0x3b;
        out_00 = out_00 + 5;
        pbVar9 = pbVar9 + 1;
      }
      if (bVar2 != 0x3e) break;
      if ((long)pbVar8 - (long)out_00 < 4) goto LAB_001a900c;
      out_00[0] = 0x26;
      out_00[1] = 0x67;
      out_00[2] = 0x74;
      out_00[3] = 0x3b;
LAB_001a8e3b:
      out_00 = out_00 + 4;
      pbVar9 = pbVar9 + 1;
    }
    uVar10 = (uint)bVar2;
    if (uVar10 == 0x3c) {
      if (3 < (long)pbVar8 - (long)out_00) {
        out_00[0] = 0x26;
        out_00[1] = 0x6c;
        out_00[2] = 0x74;
        out_00[3] = 0x3b;
        goto LAB_001a8e3b;
      }
      goto LAB_001a900c;
    }
    if (((char)bVar2 < ' ') && (1 < (byte)(bVar2 - 9))) {
      val = (uint)bVar2;
      if ((char)bVar2 < '\0') {
        if ((long)pbVar8 - (long)out_00 < 0xb) {
LAB_001a900c:
          iVar4 = 0;
LAB_001a900e:
          *outlen = (int)out_00 - (int)out;
          *inlen = (int)pbVar9 - (int)in;
          return iVar4;
        }
        if (bVar2 < 0xc0) {
          iVar4 = 0x578;
        }
        else {
          if (bVar2 < 0xe0) {
            if ((long)pbVar11 - (long)pbVar9 < 2) goto LAB_001a900c;
            uVar10 = (val & 0x1f) << 6;
            lVar5 = 1;
            lStack_50 = 2;
LAB_001a8f98:
            pbVar1 = pbVar9 + lVar5;
            uVar10 = *pbVar1 & 0x3f | uVar10;
            pbVar9 = pbVar9 + lStack_50;
            if (uVar10 < 0x100) {
              if ((0x1f < uVar10) || ((uVar10 < 0xe && ((0x2600U >> (*pbVar1 & 0x1f) & 1) != 0)))) {
LAB_001a8ff1:
                out_00 = xmlSerializeHexCharRef(out_00,uVar10);
                goto LAB_001a8de4;
              }
            }
            else if (uVar10 - 0x10000 < 0x100000 || (uVar10 - 0xe000 < 0x1ffe || uVar10 < 0xd800))
            goto LAB_001a8ff1;
          }
          else {
            if (bVar2 < 0xf0) {
              if (2 < (long)pbVar11 - (long)pbVar9) {
                uVar10 = (pbVar9[1] & 0x3f | (val & 0xf) << 6) << 6;
                lVar5 = 2;
                lStack_50 = 3;
                goto LAB_001a8f98;
              }
              goto LAB_001a900c;
            }
            if (bVar2 < 0xf8) {
              if (3 < (long)pbVar11 - (long)pbVar9) {
                uVar10 = (pbVar9[2] & 0x3f) << 6 | (pbVar9[1] & 0x3f | (uVar10 & 7) << 6) << 0xc;
                lVar5 = 3;
                lStack_50 = 4;
                goto LAB_001a8f98;
              }
              goto LAB_001a900c;
            }
          }
          iVar4 = 0x579;
        }
        xmlSaveErr(iVar4,(xmlNodePtr)0x0,(char *)0x0);
      }
      else {
        if ((uVar10 < 0xe) && ((0x2600U >> (uVar10 & 0x1f) & 1) != 0)) {
          if ((long)pbVar8 - (long)out_00 < 6) goto LAB_001a900c;
          pbVar9 = pbVar9 + 1;
          out_00 = xmlSerializeHexCharRef(out_00,val);
          goto LAB_001a8de4;
        }
        pp_Var6 = __xmlGenericError();
        p_Var3 = *pp_Var6;
        ppvVar7 = __xmlGenericErrorContext();
        (*p_Var3)(*ppvVar7,"xmlEscapeEntities : char out of range\n");
      }
      pbVar9 = pbVar9 + 1;
      iVar4 = -1;
      goto LAB_001a900e;
    }
    pbVar9 = pbVar9 + 1;
    *out_00 = bVar2;
    out_00 = out_00 + 1;
  } while( true );
}

Assistant:

static int
xmlEscapeEntities(unsigned char* out, int *outlen,
                 const xmlChar* in, int *inlen) {
    unsigned char* outstart = out;
    const unsigned char* base = in;
    unsigned char* outend = out + *outlen;
    const unsigned char* inend;
    int val;

    inend = in + (*inlen);

    while ((in < inend) && (out < outend)) {
	if (*in == '<') {
	    if (outend - out < 4) break;
	    *out++ = '&';
	    *out++ = 'l';
	    *out++ = 't';
	    *out++ = ';';
	    in++;
	    continue;
	} else if (*in == '>') {
	    if (outend - out < 4) break;
	    *out++ = '&';
	    *out++ = 'g';
	    *out++ = 't';
	    *out++ = ';';
	    in++;
	    continue;
	} else if (*in == '&') {
	    if (outend - out < 5) break;
	    *out++ = '&';
	    *out++ = 'a';
	    *out++ = 'm';
	    *out++ = 'p';
	    *out++ = ';';
	    in++;
	    continue;
	} else if (((*in >= 0x20) && (*in < 0x80)) ||
	           (*in == '\n') || (*in == '\t')) {
	    /*
	     * default case, just copy !
	     */
	    *out++ = *in++;
	    continue;
	} else if (*in >= 0x80) {
	    /*
	     * We assume we have UTF-8 input.
	     */
	    if (outend - out < 11) break;

	    if (*in < 0xC0) {
		xmlSaveErr(XML_SAVE_NOT_UTF8, NULL, NULL);
		in++;
		goto error;
	    } else if (*in < 0xE0) {
		if (inend - in < 2) break;
		val = (in[0]) & 0x1F;
		val <<= 6;
		val |= (in[1]) & 0x3F;
		in += 2;
	    } else if (*in < 0xF0) {
		if (inend - in < 3) break;
		val = (in[0]) & 0x0F;
		val <<= 6;
		val |= (in[1]) & 0x3F;
		val <<= 6;
		val |= (in[2]) & 0x3F;
		in += 3;
	    } else if (*in < 0xF8) {
		if (inend - in < 4) break;
		val = (in[0]) & 0x07;
		val <<= 6;
		val |= (in[1]) & 0x3F;
		val <<= 6;
		val |= (in[2]) & 0x3F;
		val <<= 6;
		val |= (in[3]) & 0x3F;
		in += 4;
	    } else {
		xmlSaveErr(XML_SAVE_CHAR_INVALID, NULL, NULL);
		in++;
		goto error;
	    }
	    if (!IS_CHAR(val)) {
		xmlSaveErr(XML_SAVE_CHAR_INVALID, NULL, NULL);
		in++;
		goto error;
	    }

	    /*
	     * We could do multiple things here. Just save as a char ref
	     */
	    out = xmlSerializeHexCharRef(out, val);
	} else if (IS_BYTE_CHAR(*in)) {
	    if (outend - out < 6) break;
	    out = xmlSerializeHexCharRef(out, *in++);
	} else {
	    xmlGenericError(xmlGenericErrorContext,
		"xmlEscapeEntities : char out of range\n");
	    in++;
	    goto error;
	}
    }
    *outlen = out - outstart;
    *inlen = in - base;
    return(0);
error:
    *outlen = out - outstart;
    *inlen = in - base;
    return(-1);
}